

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void RangeDec_Decode(CPpmd8 *p,UInt32 start,UInt32 size)

{
  uint uVar1;
  UInt32 UVar2;
  byte bVar3;
  int iVar4;
  
  iVar4 = start * p->Range;
  p->Low = p->Low + iVar4;
  p->Code = p->Code - iVar4;
  p->Range = size * p->Range;
  do {
    uVar1 = p->Low;
    if (0xffffff < (p->Range + uVar1 ^ uVar1)) {
      if (0x7fff < p->Range) {
        return;
      }
      p->Range = -uVar1 & 0x7fff;
    }
    UVar2 = p->Code;
    bVar3 = (*((p->Stream).In)->Read)((p->Stream).In);
    p->Code = (uint)bVar3 | UVar2 << 8;
    p->Range = p->Range << 8;
    p->Low = p->Low << 8;
  } while( true );
}

Assistant:

static void RangeDec_Decode(CPpmd8 *p, UInt32 start, UInt32 size)
{
  start *= p->Range;
  p->Low += start;
  p->Code -= start;
  p->Range *= size;

  while ((p->Low ^ (p->Low + p->Range)) < kTop ||
      (p->Range < kBot && ((p->Range = (0 - p->Low) & (kBot - 1)), 1)))
  {
    p->Code = (p->Code << 8) | p->Stream.In->Read(p->Stream.In);
    p->Range <<= 8;
    p->Low <<= 8;
  }
}